

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O0

Extra_BitMat_t * Extra_BitMatrixStart(int nSize)

{
  Extra_BitMat_t *__s;
  uint **ppuVar1;
  uint *puVar2;
  int local_1c;
  int i;
  Extra_BitMat_t *p;
  int nSize_local;
  
  __s = (Extra_BitMat_t *)malloc(0x28);
  memset(__s,0,0x28);
  __s->nSize = nSize;
  __s->nBitShift = 5;
  __s->uMask = 0x1f;
  __s->nWords = (int)((ulong)(long)nSize >> 5) + (uint)((nSize & 0x1fU) != 0);
  ppuVar1 = (uint **)malloc((long)nSize << 3);
  __s->ppData = ppuVar1;
  puVar2 = (uint *)malloc((long)(nSize * __s->nWords) << 2);
  *__s->ppData = puVar2;
  memset(*__s->ppData,0,(long)nSize * 4 * (long)__s->nWords);
  for (local_1c = 1; local_1c < nSize; local_1c = local_1c + 1) {
    __s->ppData[local_1c] = __s->ppData[local_1c + -1] + __s->nWords;
  }
  return __s;
}

Assistant:

Extra_BitMat_t * Extra_BitMatrixStart( int nSize )
{
    Extra_BitMat_t * p;
    int i;
    p = ABC_ALLOC( Extra_BitMat_t, 1 );
    memset( p, 0, sizeof(Extra_BitMat_t) );
    p->nSize     = nSize;
    p->nBitShift = (sizeof(unsigned) == 4) ?  5:  6;
    p->uMask     = (sizeof(unsigned) == 4) ? 31: 63;
    p->nWords    = nSize / (8 * sizeof(unsigned)) + ((nSize % (8 * sizeof(unsigned))) > 0);
    p->ppData    = ABC_ALLOC( unsigned *, nSize );
    p->ppData[0] = ABC_ALLOC( unsigned, nSize * p->nWords );
    memset( p->ppData[0], 0, sizeof(unsigned) * nSize * p->nWords );
    for ( i = 1; i < nSize; i++ )
        p->ppData[i] = p->ppData[i-1] + p->nWords;
    return p;
}